

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_initialize(REF_GEOM ref_geom)

{
  uint uVar1;
  REF_INT *pRVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  ref_geom->n = 0;
  iVar3 = ref_geom->max;
  if (0 < iVar3) {
    pRVar2 = ref_geom->descr + 1;
    lVar4 = 0;
    do {
      pRVar2[-1] = -1;
      lVar4 = lVar4 + 1;
      *pRVar2 = (REF_INT)lVar4;
      iVar3 = ref_geom->max;
      pRVar2 = pRVar2 + 6;
    } while (lVar4 < iVar3);
  }
  ref_geom->descr[iVar3 * 6 + -5] = -1;
  ref_geom->blank = 0;
  if ((ref_geom->ref_adj == (REF_ADJ)0x0) || (uVar1 = ref_adj_free(ref_geom->ref_adj), uVar1 == 0))
  {
    uVar1 = ref_adj_create(&ref_geom->ref_adj);
    if (uVar1 == 0) {
      return 0;
    }
    pcVar6 = "create ref_adj for ref_geom";
    uVar5 = 0x36;
  }
  else {
    pcVar6 = "free to prevent leak";
    uVar5 = 0x35;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_initialize",(ulong)uVar1,pcVar6);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_initialize(REF_GEOM ref_geom) {
  REF_INT geom;
  ref_geom_n(ref_geom) = 0;
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++) {
    ref_geom_type(ref_geom, geom) = REF_EMPTY;
    ref_geom_id(ref_geom, geom) = geom + 1;
  }
  ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
  ref_geom_blank(ref_geom) = 0;
  if (NULL != (void *)(ref_geom->ref_adj))
    RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  return REF_SUCCESS;
}